

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

void __thiscall
TreePropagator::DFSBlue
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *visited,int *count)

{
  ulong *puVar1;
  uint uVar2;
  pointer pvVar3;
  BoolView *pBVar4;
  uint *puVar5;
  bool bVar6;
  ulong uVar7;
  pointer piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = (ulong)r;
  uVar7 = uVar10 + 0x3f;
  if (-1 < (long)uVar10) {
    uVar7 = uVar10;
  }
  puVar1 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)uVar7 >> 6) +
           (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)r & 0x3f);
  *count = *count + 1;
  pvVar3 = (this->super_GraphPropagator).adj.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar8 = pvVar3[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar3[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar8) {
    uVar7 = 0;
    uVar11 = 1;
    do {
      uVar2 = piVar8[uVar7];
      pBVar4 = (this->super_GraphPropagator).es.data;
      if ((sat.assigns.data[(uint)pBVar4[uVar2].v] == '\0') ||
         ((uint)pBVar4[uVar2].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar4[uVar2].v])) {
        pBVar4 = (this->super_GraphPropagator).vs.data;
        puVar5 = *(uint **)&(this->super_GraphPropagator).endnodes.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
        uVar2 = *puVar5;
        if (uVar2 == r) {
          uVar2 = puVar5[1];
        }
        if ((sat.assigns.data[(uint)pBVar4[uVar2].v] == '\0') ||
           ((uint)pBVar4[uVar2].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar4[uVar2].v])) {
          uVar9 = (ulong)(int)uVar2;
          uVar7 = uVar9 + 0x3f;
          if (-1 < (long)uVar9) {
            uVar7 = uVar9;
          }
          if (((visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar7 >> 6) +
                (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar9 & 0x3f) & 1) == 0) {
            DFSBlue(this,uVar2,visited,count);
          }
        }
      }
      pvVar3 = (this->super_GraphPropagator).adj.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar8 = pvVar3[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar6 = uVar11 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar3[uVar10].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 8) - (long)piVar8 >> 2);
      uVar7 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar6);
  }
  return;
}

Assistant:

void TreePropagator::DFSBlue(int r, std::vector<bool>& visited, int& count) {
	visited[r] = true;
	count++;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (getNodeVar(other).isFixed() && getNodeVar(other).isFalse()) {
			continue;
		}
		if (visited[other] == false) {
			DFSBlue(other, visited, count);
		}
	}
}